

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O0

int replaceTxa(istream *in,ostream *output,path *replacement)

{
  FILE *__stream;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  size_t sVar5;
  reference pTVar6;
  reference pvVar7;
  uchar *puVar8;
  reference this;
  byte *__n;
  char *in_RSI;
  void *in_RDI;
  size_t i_1;
  TxaChunk *chunk_1;
  iterator __end1;
  iterator __begin1;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *__range1;
  int pos;
  value_type *chunk;
  runtime_error *anon_var_0;
  path rfilename;
  string replacementName;
  size_t i;
  bool indexed;
  Compressor compressor;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  chunks;
  vector<Image,_std::allocator<Image>_> images;
  TxaHeader header;
  string replacementTemplate;
  path replacementDir;
  TxaHeader *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  value_type *in_stack_fffffffffffffca0;
  size_type in_stack_fffffffffffffca8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  path *in_stack_fffffffffffffcb0;
  char *pcVar9;
  path *in_stack_fffffffffffffcb8;
  Size in_stack_fffffffffffffcc0;
  path *in_stack_fffffffffffffcd8;
  TxaHeader *in_stack_fffffffffffffd00;
  ulong local_2c0;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_2a8;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *local_2a0;
  uint32_t local_294;
  byte *local_290;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_288;
  vector<Image,_std::allocator<Image>_> *local_280;
  path *in_stack_fffffffffffffd88;
  string local_218 [112];
  string local_1a8 [32];
  string local_188 [32];
  ulong local_168;
  byte local_159 [17];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_128;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  vector<Image,_std::allocator<Image>_> local_e0;
  TxaHeader local_c8 [2];
  string local_60 [80];
  char *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::stem(in_stack_fffffffffffffcd8);
  std::filesystem::__cxx11::path::string(in_stack_fffffffffffffcb8);
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  TxaHeader::TxaHeader((TxaHeader *)0x12fa14);
  operator>>((istream *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc88);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::size(&local_c8[0].chunks);
  local_108 = 0;
  uStack_104 = 0;
  local_10c = 0;
  Image::Image((Image *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcc0,
               SUB84((ulong)in_stack_fffffffffffffcb8 >> 0x20,0));
  std::allocator<Image>::allocator((allocator<Image> *)0x12fa94);
  std::vector<Image,_std::allocator<Image>_>::vector
            ((vector<Image,_std::allocator<Image>_> *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             (allocator_type *)in_stack_fffffffffffffc98);
  std::allocator<Image>::~allocator((allocator<Image> *)0x12fac8);
  Image::~Image((Image *)0x12fad5);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::size(&local_c8[0].chunks);
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12fb16);
  std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
            ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x12fb2b);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
           (value_type *)in_stack_fffffffffffffca0,(allocator_type *)in_stack_fffffffffffffc98);
  std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
            ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x12fb5f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffca0);
  Compressor::Compressor((Compressor *)in_stack_fffffffffffffcb0);
  local_159[0] = 1;
  local_168 = 0;
  while( true ) {
    uVar1 = local_168;
    sVar3 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::size(&local_128);
    if (sVar3 <= uVar1) break;
    std::operator+(&in_stack_fffffffffffffcb8->_M_pathname,(char *)in_stack_fffffffffffffcb0);
    std::vector<TxaChunk,_std::allocator<TxaChunk>_>::operator[](&local_c8[0].chunks,local_168);
    std::operator+(in_stack_fffffffffffffc98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::__cxx11::string::~string(local_1a8);
    std::operator+(&in_stack_fffffffffffffcb8->_M_pathname,(char *)in_stack_fffffffffffffcb0);
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc88);
    std::filesystem::__cxx11::operator/(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::__cxx11::string::~string(local_218);
    Image::readPNG(in_stack_fffffffffffffd88);
    std::vector<Image,_std::allocator<Image>_>::operator[](&local_e0,local_168);
    Image::operator=((Image *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (Image *)in_stack_fffffffffffffc88);
    Image::~Image((Image *)0x12fcd5);
    std::vector<Image,_std::allocator<Image>_>::operator[](&local_e0,local_168);
    bVar2 = Compressor::canPalette
                      ((Compressor *)in_stack_fffffffffffffca0,(Image *)in_stack_fffffffffffffc98,
                       (bool)in_stack_fffffffffffffc97);
    __stream = _stderr;
    if (!bVar2) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s has too many colors to palette, disabling indexed color for all images\n"
              ,uVar4);
      local_159[0] = 0;
    }
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::__cxx11::string::~string(local_188);
    local_168 = local_168 + 1;
  }
  local_c8[0].indexed = local_159[0] & 1;
  sVar3 = std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::size(&local_128);
  __n = local_159;
  local_280 = &local_e0;
  local_290 = __n;
  local_288 = &local_128;
  parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>
            (0,sVar3,&local_290);
  sVar5 = TxaHeader::updateAndCalcBinSize(in_stack_fffffffffffffd00);
  local_294 = (uint32_t)sVar5;
  local_2a0 = &local_c8[0].chunks;
  local_2a8._M_current =
       (TxaChunk *)
       std::vector<TxaChunk,_std::allocator<TxaChunk>_>::begin
                 ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)in_stack_fffffffffffffc88);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::end
            ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)in_stack_fffffffffffffc88);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                       (__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_fffffffffffffc88);
    if (!bVar2) break;
    pTVar6 = __gnu_cxx::
             __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
             operator*(&local_2a8);
    sVar5 = align((long)(int)local_294,0x10);
    __n = (byte *)(sVar5 & 0xffffffff);
    pTVar6->offset = (uint32_t)sVar5;
    local_294 = pTVar6->length + (uint32_t)sVar5;
    __gnu_cxx::__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
    operator++(&local_2a8);
  }
  local_c8[0].filesize = local_294;
  TxaHeader::write(local_c8,(int)local_10,local_8,(size_t)__n);
  local_2c0 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::size(&local_128);
    if (sVar3 <= local_2c0) break;
    pcVar9 = local_10;
    pvVar7 = std::vector<TxaChunk,_std::allocator<TxaChunk>_>::operator[]
                       (&local_c8[0].chunks,local_2c0);
    std::ostream::seekp((long)pcVar9,pvVar7->offset);
    this_00 = &local_128;
    pcVar9 = local_10;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[](this_00,local_2c0);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13029d);
    this = std::
           vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator[](this_00,local_2c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
    std::ostream::write(pcVar9,(long)puVar8);
    local_2c0 = local_2c0 + 1;
  }
  Compressor::~Compressor
            ((Compressor *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffca0);
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)in_stack_fffffffffffffca0);
  TxaHeader::~TxaHeader((TxaHeader *)0x13031f);
  std::__cxx11::string::~string(local_60);
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  return 0;
}

Assistant:

int replaceTxa(std::istream &in, std::ostream &output, const fs::path &replacement) {
	fs::path replacementDir = replacement.parent_path();
	std::string replacementTemplate = replacement.stem().string();

	TxaHeader header;
	in >> header;

	std::vector<Image> images(header.chunks.size(), Image());
	std::vector<std::vector<uint8_t>> chunks(header.chunks.size(), std::vector<uint8_t>());
	Compressor compressor;

	bool indexed = true;

	for (size_t i = 0; i < chunks.size(); i++) {
		std::string replacementName = replacementTemplate + "_" + header.chunks[i].name;
		auto rfilename = replacementDir/fs::u8path(replacementName + ".png");

		try {
			images[i] = Image::readPNG(rfilename);
		} catch (std::runtime_error&) {
			fprintf(stderr, "Failed to load replacement %s, not replacing\n", rfilename.string().c_str());
			const auto& chunk = header.chunks[i];
			processChunkNoHeader(images[i], chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, replacementName, header.isSwitch);
		}

		if (!compressor.canPalette(images[i], false)) {
			fprintf(stderr, "%s has too many colors to palette, disabling indexed color for all images\n", replacementName.c_str());
			indexed = false;
		}
	}

	header.indexed = indexed;

	parallel_for(0, chunks.size(), []{ return Compressor(); }, [&](Compressor& c, size_t i) {
		ChunkHeader::Type type = indexed ? ChunkHeader::TYPE_INDEXED : ChunkHeader::TYPE_COLOR;
		if (!c.encodeHeaderlessChunk(chunks[i], images[i], type, header.isSwitch)) {
			throw std::runtime_error("Failed to encode chunk " + std::to_string(i));
		}
		auto& h = header.chunks[i];
		h.decodedLength = indexed ? (1024 + images[i].size.area()) : (4 * images[i].size.area());
		h.width = images[i].size.width;
		h.height = images[i].size.height;
		h.length = chunks[i].size();
	});

	int pos = header.updateAndCalcBinSize();
	for (auto& chunk : header.chunks) {
		pos = align(pos, 16);
		chunk.offset = pos;
		pos += chunk.length;
	}

	header.filesize = pos;
	header.write(output, in);
	for (size_t i = 0; i < chunks.size(); i++) {
		output.seekp(header.chunks[i].offset, output.beg);
		output.write(reinterpret_cast<const char*>(chunks[i].data()), chunks[i].size());
	}
	return 0;
}